

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::setImageLimited<unsigned_char>
          (Image<float,_gimage::PixelTraits<float>_> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *a)

{
  uchar ***pppuVar1;
  float ***pppfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long i;
  ulong uVar9;
  
  setSize(this,a->width,a->height,(long)a->depth);
  uVar5 = 0;
  uVar4 = this->height;
  if (this->height < 1) {
    uVar4 = uVar5;
  }
  uVar3 = (ulong)(uint)this->depth;
  if (this->depth < 1) {
    uVar3 = uVar5;
  }
  for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    uVar7 = this->width;
    if (this->width < 1) {
      uVar7 = uVar5;
    }
    for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
      pppuVar1 = a->img;
      pppfVar2 = this->img;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        pppfVar2[uVar6][uVar8][uVar9] = (float)pppuVar1[uVar6][uVar8][uVar9];
      }
    }
  }
  return;
}

Assistant:

void setImageLimited(const Image<S> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      for (int j=0; j<depth; j++)
        for (long k=0; k<height; k++)
          for (long i=0; i<width; i++)
          {
            img[j][k][i]=ptraits::limit(static_cast<work_t>(a.get(i, k, j)));
          }
    }